

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall sing::HttpResponse::makeErrorResponse(HttpResponse *this,string *msg)

{
  mapped_type *__rhs;
  unsigned_long __val;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  HttpStatusCode local_a8 [4];
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *msg_local;
  HttpResponse *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  std::__cxx11::string::operator+=((string *)&this->body,"<html><title>Server Error</title>");
  std::__cxx11::string::operator+=((string *)&this->body,"<body bgcolor=\"ffffff\">");
  std::__cxx11::to_string(&local_98,this->code);
  std::operator+(&local_78,&local_98," : ");
  local_a8[0] = this->code;
  __rhs = std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(&statusCode2Message_abi_cxx11_,(key_type *)local_a8);
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(&local_38,&local_58,"\n");
  std::__cxx11::string::operator+=((string *)&this->body,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+(&local_e8,"<p>",local_18);
  std::operator+(&local_c8,&local_e8,"</p>");
  std::__cxx11::string::operator+=((string *)&this->body,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::operator+=
            ((string *)&this->body,"<hr><em>sing web server</em></body></html>");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Content-Type",&local_109)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"text/html",&local_131);
  addHeader(this,&local_108,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Content-Length",&local_159);
  __val = std::__cxx11::string::size();
  std::__cxx11::to_string(&local_180,__val);
  addHeader(this,&local_158,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  return;
}

Assistant:

void HttpResponse::makeErrorResponse(const std::string& msg){//FIX ME: send error page html file
    body += "<html><title>Server Error</title>";
    body += "<body bgcolor=\"ffffff\">";
    body += std::to_string(this->code) + " : " + statusCode2Message.at(code) + "\n";
    body += "<p>" + msg + "</p>";
    body += "<hr><em>sing web server</em></body></html>";
    addHeader("Content-Type", "text/html");
    addHeader("Content-Length", std::to_string(body.size()));
}